

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

void __thiscall
bioparser::Parser<biosoup::Sequence>::Parser
          (Parser<biosoup::Sequence> *this,gzFile file,uint32_t storage_size)

{
  ulong in_RAX;
  pointer __s;
  undefined8 uStack_28;
  
  this->_vptr_Parser = (_func_int **)&PTR__Parser_00162a98;
  (this->file_)._M_t.super___uniq_ptr_impl<gzFile_s,_int_(*)(gzFile_s_*)>._M_t.
  super__Tuple_impl<0UL,_gzFile_s_*,_int_(*)(gzFile_s_*)>.
  super__Tuple_impl<1UL,_int_(*)(gzFile_s_*)>.super__Head_base<1UL,_int_(*)(gzFile_s_*),_false>.
  _M_head_impl = gzclose;
  (this->file_)._M_t.super___uniq_ptr_impl<gzFile_s,_int_(*)(gzFile_s_*)>._M_t.
  super__Tuple_impl<0UL,_gzFile_s_*,_int_(*)(gzFile_s_*)>.super__Head_base<0UL,_gzFile_s_*,_false>.
  _M_head_impl = file;
  (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uStack_28 = in_RAX;
  __s = (pointer)operator_new(0x10000);
  (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = __s;
  (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = __s;
  (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = __s + 0x10000;
  memset(__s,0,0x10000);
  (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = __s + 0x10000;
  this->buffer_ptr_ = 0;
  this->buffer_bytes_ = 0;
  uStack_28 = uStack_28 & 0xffffffffffffff;
  std::vector<char,_std::allocator<char>_>::vector
            (&this->storage_,(ulong)storage_size,(value_type *)((long)&uStack_28 + 7),
             (allocator_type *)((long)&uStack_28 + 6));
  this->storage_ptr_ = 0;
  return;
}

Assistant:

Parser(gzFile file, std::uint32_t storage_size)
      : file_(file, gzclose),
        buffer_(65536, 0),  // 64 kB
        buffer_ptr_(0),
        buffer_bytes_(0),
        storage_(storage_size, 0),
        storage_ptr_(0) {}